

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_test.cpp
# Opt level: O2

void flatbuffers::tests::AlignmentTest(void)

{
  uchar uVar1;
  bool bVar2;
  Offset<OuterLarge> large_00;
  Offset<flatbuffers::Vector<const_BadAlignmentSmall_*,_unsigned_int>_> small_00;
  Offset<BadAlignmentRoot> root;
  Offset<flatbuffers::Vector<const_EvenSmallStruct_*,_unsigned_int>_> even_structs;
  Offset<flatbuffers::Vector<const_OddSmallStruct_*,_unsigned_int>_> odd_structs;
  Offset<SmallStructs> root_00;
  uint8_t *puVar3;
  uint *puVar4;
  Vector<const_EvenSmallStruct_*,_unsigned_int> *pVVar5;
  return_type pEVar6;
  Vector<const_OddSmallStruct_*,_unsigned_int> *pVVar7;
  return_type pOVar8;
  SmallStructs *this;
  uoffset_t i_1;
  long lVar9;
  uoffset_t i;
  ulong uVar10;
  initializer_list<EvenSmallStruct> __l;
  initializer_list<OddSmallStruct> __l_00;
  allocator_type local_181;
  vector<EvenSmallStruct,_std::allocator<EvenSmallStruct>_> even_vector;
  vector<OddSmallStruct,_std::allocator<OddSmallStruct>_> odd_vector;
  BadAlignmentSmall *small;
  BadAlignmentLarge large;
  FlatBufferBuilder builder;
  Verifier verifier_small_structs;
  Verifier verifier;
  
  builder.buf_.allocator_ = (Allocator *)0x0;
  builder.buf_.own_allocator_ = false;
  builder.buf_.initial_size_ = 0x400;
  builder.buf_.max_size_ = 0x7fffffff;
  builder.buf_.buffer_minalign_ = 8;
  builder.buf_.reserved_ = 0;
  builder.buf_.size_ = 0;
  builder.length_of_64_bit_region_ = 0;
  builder.nested = false;
  builder.finished = false;
  builder.buf_.buf_ = (uint8_t *)0x0;
  builder.buf_.cur_._0_6_ = 0;
  builder.buf_.cur_._6_2_ = 0;
  builder.buf_.scratch_._0_6_ = 0;
  builder._78_8_ = 0;
  builder.minalign_ = 1;
  builder.force_defaults_ = false;
  builder.dedup_vtables_ = true;
  builder.string_pool = (StringOffsetMap *)0x0;
  large.var_0_ = 0;
  large_00 = CreateOuterLarge(&builder,&large);
  small_00 = FlatBufferBuilderImpl<false>::CreateUninitializedVectorOfStructs<BadAlignmentSmall>
                       (&builder,9,&small);
  root = CreateBadAlignmentRoot(&builder,large_00,small_00);
  FlatBufferBuilderImpl<false>::Finish<BadAlignmentRoot>(&builder,root,(char *)0x0);
  puVar3 = FlatBufferBuilderImpl<false>::GetBufferPointer(&builder);
  VerifierTemplate<false>::VerifierTemplate
            (&verifier,puVar3,(ulong)builder.buf_.size_,0x40,1000000,true);
  bVar2 = VerifierTemplate<false>::VerifyBuffer<BadAlignmentRoot>(&verifier,(char *)0x0);
  TestEq<bool,bool>(true,bVar2,"\'true\' != \'verifier.VerifyBuffer<BadAlignmentRoot>(nullptr)\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/alignment_test.cpp"
                    ,0x1c,"");
  FlatBufferBuilderImpl<false>::Clear(&builder);
  verifier_small_structs.buf_ = (uint8_t *)CONCAT26(verifier_small_structs.buf_._6_2_,0x10401030102)
  ;
  __l._M_len = 3;
  __l._M_array = (iterator)&verifier_small_structs;
  std::vector<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>::vector
            (&even_vector,__l,(allocator_type *)&odd_vector);
  verifier_small_structs.buf_ = (uint8_t *)0x201070809040506;
  verifier_small_structs.size_._0_1_ = 3;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&verifier_small_structs;
  std::vector<OddSmallStruct,_std::allocator<OddSmallStruct>_>::vector
            (&odd_vector,__l_00,&local_181);
  even_structs = FlatBufferBuilderImpl<false>::
                 CreateVectorOfStructs<EvenSmallStruct,_flatbuffers::Offset,_flatbuffers::Vector,_std::allocator<EvenSmallStruct>_>
                           (&builder,&even_vector);
  odd_structs = FlatBufferBuilderImpl<false>::
                CreateVectorOfStructs<OddSmallStruct,_flatbuffers::Offset,_flatbuffers::Vector,_std::allocator<OddSmallStruct>_>
                          (&builder,&odd_vector);
  root_00 = CreateSmallStructs(&builder,even_structs,odd_structs);
  FlatBufferBuilderImpl<false>::Finish<SmallStructs>(&builder,root_00,(char *)0x0);
  puVar3 = FlatBufferBuilderImpl<false>::GetBufferPointer(&builder);
  VerifierTemplate<false>::VerifierTemplate
            (&verifier_small_structs,puVar3,(ulong)builder.buf_.size_,0x40,1000000,true);
  bVar2 = VerifierTemplate<false>::VerifyBuffer<SmallStructs>(&verifier_small_structs,(char *)0x0);
  TestEq<bool,bool>(true,bVar2,
                    "\'true\' != \'verifier_small_structs.VerifyBuffer<SmallStructs>(nullptr)\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/alignment_test.cpp"
                    ,0x3e,"");
  puVar4 = (uint *)FlatBufferBuilderImpl<false>::GetBufferPointer(&builder);
  if (puVar4 == (uint *)0x0) {
    this = (SmallStructs *)0x0;
  }
  else {
    this = (SmallStructs *)((ulong)*puVar4 + (long)puVar4);
  }
  pVVar5 = SmallStructs::even_structs(this);
  TestEq<unsigned_int,unsigned_long>
            (*(uint *)pVVar5,
             (long)even_vector.super__Vector_base<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)even_vector.super__Vector_base<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 1,
             "\'root_msg->even_structs()->size()\' != \'even_vector.size()\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/alignment_test.cpp"
             ,0x44,"");
  uVar10 = 0;
  while( true ) {
    pVVar5 = SmallStructs::even_structs(this);
    if (*(uint *)pVVar5 <= uVar10) break;
    uVar1 = even_vector.super__Vector_base<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10].var_0_;
    pVVar5 = SmallStructs::even_structs(this);
    pEVar6 = Vector<const_EvenSmallStruct_*,_unsigned_int>::Get(pVVar5,(uint)uVar10);
    TestEq<unsigned_char,unsigned_char>
              (uVar1,pEVar6->var_0_,
               "\'even_vector[i].var_0()\' != \'root_msg->even_structs()->Get(i)->var_0()\'",
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/alignment_test.cpp"
               ,0x47,"");
    uVar1 = even_vector.super__Vector_base<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10].var_1_;
    pVVar5 = SmallStructs::even_structs(this);
    pEVar6 = Vector<const_EvenSmallStruct_*,_unsigned_int>::Get(pVVar5,(uint)uVar10);
    TestEq<unsigned_char,unsigned_char>
              (uVar1,pEVar6->var_1_,
               "\'even_vector[i].var_1()\' != \'root_msg->even_structs()->Get(i)->var_1()\'",
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/alignment_test.cpp"
               ,0x48,"");
    uVar10 = uVar10 + 1;
  }
  pVVar7 = SmallStructs::odd_structs(this);
  TestEq<unsigned_int,unsigned_long>
            (*(uint *)pVVar7,
             (long)even_vector.super__Vector_base<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)even_vector.super__Vector_base<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 1,
             "\'root_msg->odd_structs()->size()\' != \'even_vector.size()\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/alignment_test.cpp"
             ,0x4b,"");
  lVar9 = 0;
  uVar10 = 0;
  while( true ) {
    pVVar7 = SmallStructs::odd_structs(this);
    if (*(uint *)pVVar7 <= uVar10) break;
    uVar1 = (&(odd_vector.super__Vector_base<OddSmallStruct,_std::allocator<OddSmallStruct>_>.
               _M_impl.super__Vector_impl_data._M_start)->var_0_)[lVar9];
    pVVar7 = SmallStructs::odd_structs(this);
    pOVar8 = Vector<const_OddSmallStruct_*,_unsigned_int>::Get(pVVar7,(uint)uVar10);
    TestEq<unsigned_char,unsigned_char>
              (uVar1,pOVar8->var_0_,
               "\'odd_vector[i].var_0()\' != \'root_msg->odd_structs()->Get(i)->var_0()\'",
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/alignment_test.cpp"
               ,0x4d,"");
    uVar1 = (&(odd_vector.super__Vector_base<OddSmallStruct,_std::allocator<OddSmallStruct>_>.
               _M_impl.super__Vector_impl_data._M_start)->var_1_)[lVar9];
    pVVar7 = SmallStructs::odd_structs(this);
    pOVar8 = Vector<const_OddSmallStruct_*,_unsigned_int>::Get(pVVar7,(uint)uVar10);
    TestEq<unsigned_char,unsigned_char>
              (uVar1,pOVar8->var_1_,
               "\'odd_vector[i].var_1()\' != \'root_msg->odd_structs()->Get(i)->var_1()\'",
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/alignment_test.cpp"
               ,0x4e,"");
    uVar10 = uVar10 + 1;
    lVar9 = lVar9 + 3;
  }
  std::_Vector_base<OddSmallStruct,_std::allocator<OddSmallStruct>_>::~_Vector_base
            (&odd_vector.super__Vector_base<OddSmallStruct,_std::allocator<OddSmallStruct>_>);
  std::_Vector_base<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>::~_Vector_base
            (&even_vector.super__Vector_base<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>);
  FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&builder);
  return;
}

Assistant:

void AlignmentTest() {
  FlatBufferBuilder builder;

  BadAlignmentLarge large;
  Offset<OuterLarge> outer_large = CreateOuterLarge(builder, &large);

  BadAlignmentSmall *small;
  Offset<Vector<const BadAlignmentSmall *>> small_offset =
      builder.CreateUninitializedVectorOfStructs(9, &small);
  (void)small;  // We do not have to write data to trigger the test failure

  Offset<BadAlignmentRoot> root =
      CreateBadAlignmentRoot(builder, outer_large, small_offset);

  builder.Finish(root);

  Verifier verifier(builder.GetBufferPointer(), builder.GetSize());
  TEST_ASSERT(verifier.VerifyBuffer<BadAlignmentRoot>(nullptr));


  // ============= Test Small Structs Vector misalignment ========

  builder.Clear();

  // creating 5 structs with 2 bytes each
  // 10 bytes in total for Vector data is needed
  std::vector<EvenSmallStruct> even_vector = { { 2, 1 }, { 3, 1 }, { 4, 1 } };
  std::vector<OddSmallStruct> odd_vector = { { 6, 5, 4 },
                                             { 9, 8, 7 },
                                             { 1, 2, 3 } };
  // CreateVectorOfStructs is used in the generated CreateSmallStructsDirect()
  // method, but we test it directly
  Offset<Vector<const EvenSmallStruct *>> even_structs_offset =
      builder.CreateVectorOfStructs<EvenSmallStruct>(even_vector);
  Offset<Vector<const OddSmallStruct *>> odd_structs_offset =
      builder.CreateVectorOfStructs<OddSmallStruct>(odd_vector);
  Offset<SmallStructs> small_structs_root =
      CreateSmallStructs(builder, even_structs_offset, odd_structs_offset);

  builder.Finish(small_structs_root);

  // Save the binary that we later can annotate with `flatc --annotate` command
  // NOTE: the conversion of the JSON data to --binary via `flatc --binary`
  //       command is not changed with that fix and was always producing the
  //       correct binary data.
  // SaveFile("alignment_test_{before,after}_fix.bin",
  //          reinterpret_cast<char *>(builder.GetBufferPointer()),
  //          builder.GetSize(), true);

  Verifier verifier_small_structs(builder.GetBufferPointer(),
                                  builder.GetSize());
  TEST_ASSERT(verifier_small_structs.VerifyBuffer<SmallStructs>(nullptr));

  // Reading SmallStructs vector values back and compare with original
  auto root_msg =
      flatbuffers::GetRoot<SmallStructs>(builder.GetBufferPointer());

  TEST_EQ(root_msg->even_structs()->size(), even_vector.size());
  for (flatbuffers::uoffset_t i = 0; i < root_msg->even_structs()->size();
       ++i) {
    TEST_EQ(even_vector[i].var_0(), root_msg->even_structs()->Get(i)->var_0());
    TEST_EQ(even_vector[i].var_1(), root_msg->even_structs()->Get(i)->var_1());
  }

  TEST_EQ(root_msg->odd_structs()->size(), even_vector.size());
  for (flatbuffers::uoffset_t i = 0; i < root_msg->odd_structs()->size(); ++i) {
    TEST_EQ(odd_vector[i].var_0(), root_msg->odd_structs()->Get(i)->var_0());
    TEST_EQ(odd_vector[i].var_1(), root_msg->odd_structs()->Get(i)->var_1());
  }
}